

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-direct-master.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  BoolVector wrap_00;
  SaveBlock save;
  CoordinateVector ghosts_00;
  LoadBlock load_;
  DivisionsVector divs;
  ostream *poVar1;
  _Manager_type p_Var2;
  undefined8 uVar3;
  _Invoker_type in_stack_ffffffffffffe748;
  undefined8 uStack_18b0;
  environment env;
  code *local_18a8 [2];
  code *pcVar4;
  code *q_policy;
  code *pcVar5;
  CoordinateVector ghosts;
  communicator local_1848;
  communicator world;
  ContiguousAssigner assigner;
  _Any_data local_1808;
  code *local_17f8;
  code *local_17f0;
  _Any_data local_17e8;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  _Any_data local_17c8;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  _Vector_base<int,_std::allocator<int>_> local_17a8;
  _Vector_base<int,_std::allocator<int>_> local_1790;
  BoolVector wrap;
  _Bvector_base<std::allocator<bool>_> local_1750;
  BoolVector share_face;
  _Bvector_base<std::allocator<bool>_> local_1700;
  code *local_16d8;
  undefined8 local_16d0;
  Bounds domain;
  Master master;
  
  diy::mpi::environment::environment(&env,argc,argv);
  diy::mpi::communicator::communicator(&world);
  assigner.super_StaticAssigner.super_Assigner.size_ = 8;
  assigner.super_StaticAssigner.super_Assigner.nblocks_ = 0x20;
  assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
       (_func_int **)&PTR__Assigner_00138558;
  diy::Bounds<int>::Bounds(&domain,3);
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[2] = 0;
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 0;
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 0;
  domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[2] = 0xff;
  domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 0xff;
  domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 0xff;
  poVar1 = std::operator<<((ostream *)&std::cout,"Rank ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,world.rank_);
  poVar1 = std::operator<<(poVar1,":");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_1848.comm_.data = world.comm_.data;
  local_1848.owner_ = false;
  pcVar5 = Block::create;
  local_18a8[1] = (_Manager_type)0x0;
  local_18a8[0] = Block::destroy;
  q_policy = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
  pcVar4 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
  local_17c8._M_unused._M_object = (void *)0x0;
  local_17c8._8_8_ = 0;
  local_17b8 = 0;
  uStack_17b0 = 0;
  local_17e8._M_unused._M_object = (void *)0x0;
  local_17e8._8_8_ = 0;
  local_17d8 = 0;
  uStack_17d0 = 0;
  p_Var2 = (_Manager_type)operator_new(0x10);
  *(undefined ***)p_Var2 = &PTR_unload_incoming_001385d8;
  *(undefined8 *)(p_Var2 + 8) = 0x1000;
  save.super__Function_base._M_functor._8_8_ = &local_17e8;
  save.super__Function_base._M_functor._M_unused._M_object = &local_17c8;
  save.super__Function_base._M_manager = p_Var2;
  save._M_invoker = in_stack_ffffffffffffe748;
  load_.super__Function_base._M_functor._8_8_ = local_18a8[0];
  load_.super__Function_base._M_functor._M_unused._M_object = (void *)uStack_18b0;
  load_.super__Function_base._M_manager = local_18a8[1];
  load_._M_invoker = pcVar4;
  diy::Master::Master(&master,&local_1848,1,-1,(CreateBlock *)&stack0xffffffffffffe778,
                      (DestroyBlock *)local_18a8,(ExternalStorage *)0x0,save,load_,
                      (QueuePolicy *)q_policy);
  std::_Function_base::~_Function_base((_Function_base *)&local_17e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_17c8);
  std::_Function_base::~_Function_base((_Function_base *)local_18a8);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffe778);
  diy::mpi::communicator::~communicator(&local_1848);
  share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::push_back(&share_face,true);
  wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::push_back(&wrap,true);
  std::vector<bool,_std::allocator<bool>_>::push_back(&wrap,true);
  ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_1808._0_4_ = 1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&ghosts,(int *)local_1808._M_pod_data);
  local_1808._0_4_ = 2;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&ghosts,(int *)local_1808._M_pod_data);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_1750,&share_face);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_1700,&wrap);
  uVar3 = 0x104c50;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_1790,&ghosts);
  local_17a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_17a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_17a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wrap_00.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = &local_1790;
  wrap_00.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&local_1700;
  wrap_00.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)&local_17a8;
  wrap_00.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = uVar3;
  wrap_00.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)in_stack_ffffffffffffe748;
  ghosts_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)local_18a8[0];
  ghosts_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)uStack_18b0;
  ghosts_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_18a8[1];
  divs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)q_policy;
  divs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)pcVar4;
  divs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)pcVar5;
  diy::decompose<diy::Bounds<int>>
            (3,world.rank_,&domain,&assigner.super_StaticAssigner,&master,(BoolVector *)&local_1750,
             wrap_00,ghosts_00,divs);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_17a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1790);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_1700);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_1750);
  local_16d8 = Block::show_link;
  local_16d0 = 0;
  local_1808._M_unused._M_object = (void *)0x0;
  local_1808._8_8_ = 0;
  local_17f0 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
               _M_invoke;
  local_17f8 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
               _M_manager;
  diy::Master::foreach<void(Block::*)(diy::Master::ProxyWithLink_const&)>
            (&master,(offset_in_Block_to_subr *)&local_16d8,(Skip *)&local_1808);
  std::_Function_base::~_Function_base((_Function_base *)&local_1808);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&ghosts.super__Vector_base<int,_std::allocator<int>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&wrap.super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&share_face.super__Bvector_base<std::allocator<bool>_>);
  diy::Master::~Master(&master);
  diy::Bounds<int>::~Bounds(&domain);
  diy::mpi::communicator::~communicator(&world);
  diy::mpi::environment::~environment(&env);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  diy::mpi::environment     env(argc, argv);
  diy::mpi::communicator    world;

  int                       size    = 8;
  int                       nblocks = 32;
  diy::ContiguousAssigner   assigner(size, nblocks);
  //diy::RoundRobinAssigner   assigner(size, nblocks);

  Bounds domain(3);
  domain.min[0] = domain.min[1] = domain.min[2] = 0;
  domain.max[0] = domain.max[1] = domain.max[2] = 255;
  //domain.max[0] = domain.max[1] = domain.max[2] = 128;

  int rank = world.rank();
  std::cout << "Rank " << rank << ":" << std::endl;
  diy::Master master(world, 1, -1, &Block::create, &Block::destroy);

  diy::RegularDecomposer<Bounds>::BoolVector          share_face;
  share_face.push_back(true);
  diy::RegularDecomposer<Bounds>::BoolVector          wrap;
  wrap.push_back(true);
  wrap.push_back(true);
  diy::RegularDecomposer<Bounds>::CoordinateVector    ghosts;
  ghosts.push_back(1); ghosts.push_back(2);
  diy::decompose(3, rank, domain, assigner, master, share_face, wrap, ghosts);

  master.foreach(&Block::show_link);
}